

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O3

IntrinsicResult MiniScript::intrinsic_round(Context *context,IntrinsicResult partialResult)

{
  anon_union_8_3_2f476f46_for_data aVar1;
  ValueType VVar2;
  int32_t iVar3;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar4;
  undefined2 *puVar5;
  long *plVar6;
  undefined8 *puVar7;
  double dVar8;
  anon_union_8_3_2f476f46_for_data local_90;
  undefined1 local_88 [8];
  anon_union_8_3_2f476f46_for_data local_80;
  long *local_78;
  char local_70;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_68;
  bool local_60;
  _func_int **local_58;
  Value local_50;
  Value local_40;
  
  local_60 = false;
  pDVar4 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar4->super_RefCountedStorage).refCount = 1;
  (pDVar4->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001bf0d8;
  pDVar4->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x2;
  pDVar4->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar5 = (undefined2 *)operator_new__(2);
  pDVar4->mSize = (long)puVar5;
  *puVar5 = 0x78;
  local_68 = pDVar4;
  Context::GetVar((Context *)local_88,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  local_90.number = local_80.number;
  if (local_88[0] != Number) {
    local_90.number = 0.0;
  }
  if (local_80.ref != (RefCountedStorage *)0x0 && Temp < local_88[0]) {
    plVar6 = &(local_80.ref)->refCount;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (*(local_80.ref)->_vptr_RefCountedStorage[1])();
    }
    local_80.number = 0.0;
  }
  if ((local_68 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     (local_60 == false)) {
    plVar6 = &(local_68->super_RefCountedStorage).refCount;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (*(local_68->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_68 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  local_70 = '\0';
  plVar6 = (long *)operator_new(0x30);
  plVar6[1] = 1;
  *plVar6 = (long)&PTR__StringStorage_001bf0d8;
  plVar6[3] = 0xe;
  plVar6[4] = -1;
  puVar7 = (undefined8 *)operator_new__(0xe);
  plVar6[2] = (long)puVar7;
  *(undefined8 *)((long)puVar7 + 6) = 0x736563616c506c;
  *puVar7 = 0x506c616d69636564;
  local_78 = plVar6;
  Context::GetVar((Context *)local_88,(String *)partialResult.rs,(LocalOnlyMode)&local_78);
  iVar3 = Value::IntValue((Value *)local_88);
  if ((Temp < local_88[0]) && (local_80.ref != (RefCountedStorage *)0x0)) {
    plVar6 = &(local_80.ref)->refCount;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (*(local_80.ref)->_vptr_RefCountedStorage[1])();
    }
    local_80.number = 0.0;
  }
  if ((local_78 != (long *)0x0) && (local_70 == '\0')) {
    plVar6 = local_78 + 1;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (**(code **)(*local_78 + 8))();
    }
    local_78 = (long *)0x0;
  }
  if (iVar3 == 0) {
    local_40.data.number = round(local_90.number);
    local_40.type = Number;
    local_40.noInvoke = false;
    local_40.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_40);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar1 = local_40.data;
    VVar2 = local_40.type;
  }
  else {
    local_58 = (_func_int **)pow(10.0,(double)iVar3);
    dVar8 = round(local_90.number * (double)local_58);
    local_50.data.number = dVar8 / (double)local_58;
    local_50.type = Number;
    local_50.noInvoke = false;
    local_50.localOnly = Off;
    (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
    IntrinsicResult::ensureStorage((IntrinsicResult *)context);
    Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                     &local_50);
    *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
    aVar1 = local_50.data;
    VVar2 = local_50.type;
  }
  if ((Temp < VVar2) && (aVar1.ref != (RefCountedStorage *)0x0)) {
    plVar6 = &(aVar1.ref)->refCount;
    *plVar6 = *plVar6 + -1;
    if (*plVar6 == 0) {
      (*(aVar1.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_round(Context *context, IntrinsicResult partialResult) {
		double num = context->GetVar("x").DoubleValue();
		long decimalPlaces = context->GetVar("decimalPlaces").IntValue();
		if (decimalPlaces == 0) return IntrinsicResult(round(num));	// easy case
		double f = pow(10, decimalPlaces);
		return IntrinsicResult(round(num*f) / f);
	}